

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

int64_t __thiscall libtorrent::bdecode_node::int_value(bdecode_node *this)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = (ulong)this->m_root_tokens[(long)this->m_token_idx + 1] & 0x1fffffff;
  uVar3 = (ulong)this->m_root_tokens[this->m_token_idx] & 0x1fffffff;
  cVar1 = this->m_buffer[uVar3 + 1];
  uVar6 = (ulong)(cVar1 == '-');
  if ((long)uVar6 < (long)(uVar5 - uVar3)) {
    uVar6 = uVar6 + uVar3;
    lVar7 = 0;
    do {
      bVar2 = this->m_buffer[uVar6 + 1];
      uVar3 = (ulong)bVar2;
      if (uVar3 == 0x65) break;
      if (0xccccccccccccccc < lVar7) {
        return 0;
      }
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        return 0;
      }
      if ((long)(-0x7fffffffffffffd1 - uVar3) < lVar7 * 10) {
        return 0;
      }
      lVar7 = lVar7 * 10 + uVar3 + -0x30;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  else {
    lVar7 = 0;
  }
  lVar4 = -lVar7;
  if (cVar1 != '-') {
    lVar4 = lVar7;
  }
  return lVar4;
}

Assistant:

std::int64_t bdecode_node::int_value() const
	{
		TORRENT_ASSERT(type() == int_t);
		bdecode_token const& t = m_root_tokens[m_token_idx];
		int const size = token_source_span(t);
		TORRENT_ASSERT(t.type == bdecode_token::integer);

		// +1 is to skip the 'i'
		char const* ptr = m_buffer + t.offset + 1;
		std::int64_t val = 0;
		bool const negative = (*ptr == '-');
		bdecode_errors::error_code_enum ec = bdecode_errors::no_error;
		char const* end = parse_int(ptr + int(negative)
			, ptr + size, 'e', val, ec);
		if (ec) return 0;
		TORRENT_UNUSED(end);
		TORRENT_ASSERT(end < ptr + size);
		if (negative) val = -val;
		return val;
	}